

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O0

int __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::UArrIntermediateNode::remove
          (UArrIntermediateNode *this,char *__filename)

{
  bool bVar1;
  undefined1 in_DL;
  Top TVar2;
  int i;
  Top *in_stack_ffffffffffffffa8;
  UArrIntermediateNode *l;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_2c;
  undefined4 local_14;
  _func_int **local_c;
  undefined4 local_4;
  
  local_14 = CONCAT31(local_14._1_3_,in_DL);
  local_4 = local_14;
  local_2c = 0;
  l = this;
  local_c = (_func_int **)__filename;
  while( true ) {
    if (*(int *)&(l->super_IntermediateNode).field_0x14 <= local_2c) {
      *(undefined4 *)&(this->super_IntermediateNode).field_0x14 = 0;
      this->_nodes[0] = (Node *)0x0;
      return (int)this;
    }
    TVar2 = SubstitutionTree<Indexing::LiteralClause>::Node::top
                      ((Node *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    in_stack_ffffffffffffffc0 =
         CONCAT31((int3)((uint)in_stack_ffffffffffffffc0 >> 8),TVar2._inner._inner._content[7]);
    this = (UArrIntermediateNode *)&stack0xfffffffffffffff4;
    bVar1 = Kernel::operator==((Top *)l,in_stack_ffffffffffffffa8);
    if (bVar1) break;
    local_2c = local_2c + 1;
  }
  *(int *)&(l->super_IntermediateNode).field_0x14 =
       *(int *)&(l->super_IntermediateNode).field_0x14 + -1;
  l->_nodes[local_2c] = l->_nodes[*(int *)&(l->super_IntermediateNode).field_0x14];
  l->_nodes[*(int *)&(l->super_IntermediateNode).field_0x14] = (Node *)0x0;
  return (int)l;
}

Assistant:

void SubstitutionTree<LeafData_>::UArrIntermediateNode::remove(TermList::Top t)
{
  for(int i=0;i<_size;i++) {
    if(t == _nodes[i]->top()) {
      _size--;
      _nodes[i]=_nodes[_size];
      _nodes[_size]=0;
      return;
    }
  }
  ASSERTION_VIOLATION;
}